

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::MicroStringPrevTest_AssignmentViaSetString_Test::
TestBody(MicroStringPrevTest_AssignmentViaSetString_Test *this)

{
  bool bVar1;
  Arena *pAVar2;
  size_t prev_arena_used;
  size_t expected_string_used;
  size_t sVar3;
  size_type sVar4;
  char *message;
  string_view local_a0;
  AssertHelper local_90 [3];
  Message local_78;
  string_view local_70;
  string_view local_60;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  bool will_reuse;
  size_t self_used;
  size_t used;
  MicroString source;
  MicroStringPrevTest_AssignmentViaSetString_Test *this_local;
  
  source.rep_ = this;
  pAVar2 = MicroStringPrevTest::arena(&this->super_MicroStringPrevTest);
  used = (size_t)MicroStringPrevTest::MakeFromState(kString,pAVar2);
  prev_arena_used = MicroStringPrevTest::arena_space_used(&this->super_MicroStringPrevTest);
  expected_string_used =
       MicroString::SpaceUsedExcludingSelfLong(&(this->super_MicroStringPrevTest).str_);
  sVar3 = MicroString::Capacity(&(this->super_MicroStringPrevTest).str_);
  join_0x00000010_0x00000000_ = MicroString::Get((MicroString *)&used);
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_);
  pAVar2 = MicroStringPrevTest::arena(&this->super_MicroStringPrevTest);
  MicroString::Set(&(this->super_MicroStringPrevTest).str_,(MicroString *)&used,pAVar2);
  local_60 = MicroString::Get(&(this->super_MicroStringPrevTest).str_);
  local_70 = MicroString::Get((MicroString *)&used);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            ((EqHelper *)local_50,"str_.Get()","source.Get()",&local_60,&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x307,message);
    testing::internal::AssertHelper::operator=(local_90,&local_78);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  if (sVar3 < sVar4) {
    local_a0 = MicroString::Get(&(this->super_MicroStringPrevTest).str_);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_a0);
    MicroStringPrevTest::ExpectMemoryUsed
              (&this->super_MicroStringPrevTest,prev_arena_used,true,sVar4 + 2,(MicroString *)0x0);
  }
  else {
    MicroStringPrevTest::ExpectMemoryUsed
              (&this->super_MicroStringPrevTest,prev_arena_used,false,expected_string_used,
               (MicroString *)0x0);
  }
  bVar1 = MicroStringPrevTest::has_arena(&this->super_MicroStringPrevTest);
  if (!bVar1) {
    MicroString::Destroy((MicroString *)&used);
  }
  return;
}

Assistant:

TEST_P(MicroStringPrevTest, AssignmentViaSetString) {
  MicroString source = MakeFromState(kString, arena());

  const size_t used = arena_space_used();
  const size_t self_used = str_.SpaceUsedExcludingSelfLong();
  const bool will_reuse = str_.Capacity() >= source.Get().size();
  str_.Set(source, arena());
  EXPECT_EQ(str_.Get(), source.Get());
  if (will_reuse) {
    ExpectMemoryUsed(used, false, self_used);
  } else {
    ExpectMemoryUsed(used, true, kMicroRepSize + str_.Get().size());
  }

  if (!has_arena()) source.Destroy();
}